

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O0

float __thiscall VPath::VPathData::length(VPathData *this)

{
  bool bVar1;
  reference pEVar2;
  VPointF *p2;
  VPointF *in_RDI;
  float fVar3;
  Element e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *__range1;
  size_t i;
  const_reference in_stack_ffffffffffffff68;
  const_reference in_stack_ffffffffffffff70;
  const_reference in_stack_ffffffffffffff78;
  VLine *in_stack_ffffffffffffff80;
  VLine local_44;
  Element local_31;
  Element *local_30;
  __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
  local_28;
  VPointF *local_20;
  size_type local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((uint)in_RDI[8].my & 1) == 0) {
    fVar3 = in_RDI[8].mx;
  }
  else {
    *(undefined1 *)&in_RDI[8].my = 0;
    in_RDI[8].mx = 0.0;
    local_18 = 0;
    local_20 = in_RDI + 3;
    local_28._M_current =
         (Element *)
         std::vector<VPath::Element,_std::allocator<VPath::Element>_>::begin
                   ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)
                    in_stack_ffffffffffffff68);
    local_30 = (Element *)
               std::vector<VPath::Element,_std::allocator<VPath::Element>_>::end
                         ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)
                          in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      pEVar2 = __gnu_cxx::
               __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
               ::operator*(&local_28);
      local_31 = *pEVar2;
      p2 = (VPointF *)(ulong)local_31;
      switch(p2) {
      case (VPointF *)0x0:
        local_18 = local_18 + 1;
        break;
      case (VPointF *)0x1:
        in_stack_ffffffffffffff80 =
             (VLine *)std::vector<VPointF,_std::allocator<VPointF>_>::operator[]
                                ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,local_18 - 1);
        std::vector<VPointF,_std::allocator<VPointF>_>::operator[]
                  ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,local_18);
        VLine::VLine(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        fVar3 = VLine::length(&local_44);
        in_RDI[8].mx = fVar3 + in_RDI[8].mx;
        local_18 = local_18 + 1;
        break;
      case (VPointF *)0x2:
        in_stack_ffffffffffffff68 =
             std::vector<VPointF,_std::allocator<VPointF>_>::operator[]
                       ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,local_18 - 1);
        in_stack_ffffffffffffff70 =
             std::vector<VPointF,_std::allocator<VPointF>_>::operator[]
                       ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,local_18);
        in_stack_ffffffffffffff78 =
             std::vector<VPointF,_std::allocator<VPointF>_>::operator[]
                       ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,local_18 + 1);
        std::vector<VPointF,_std::allocator<VPointF>_>::operator[]
                  ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI,local_18 + 2);
        VBezier::fromPoints(in_RDI,p2,(VPointF *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                           );
        fVar3 = VBezier::length((VBezier *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        in_RDI[8].mx = fVar3 + in_RDI[8].mx;
        local_18 = local_18 + 3;
        break;
      case (VPointF *)0x3:
      }
      __gnu_cxx::
      __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
      ::operator++(&local_28);
    }
    fVar3 = in_RDI[8].mx;
  }
  return fVar3;
}

Assistant:

float VPath::VPathData::length() const
{
    if (!mLengthDirty) return mLength;

    mLengthDirty = false;
    mLength = 0.0;

    size_t i = 0;
    for (auto e : m_elements) {
        switch (e) {
        case VPath::Element::MoveTo:
            i++;
            break;
        case VPath::Element::LineTo: {
            mLength += VLine(m_points[i - 1], m_points[i]).length();
            i++;
            break;
        }
        case VPath::Element::CubicTo: {
            mLength += VBezier::fromPoints(m_points[i - 1], m_points[i],
                                           m_points[i + 1], m_points[i + 2])
                           .length();
            i += 3;
            break;
        }
        case VPath::Element::Close:
            break;
        }
    }

    return mLength;
}